

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_util.cc
# Opt level: O0

bool libwebm::CopyMasteringMetadata(MasteringMetadata *parser_mm,MasteringMetadata *muxer_mm)

{
  bool bVar1;
  MasteringMetadata *in_RSI;
  long *in_RDI;
  PrimaryChromaticityPtr wp_ptr;
  PrimaryChromaticityPtr b_ptr;
  PrimaryChromaticityPtr g_ptr;
  PrimaryChromaticityPtr r_ptr;
  nullptr_t in_stack_ffffffffffffff88;
  MasteringMetadata *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb4;
  undefined1 in_stack_ffffffffffffffb5;
  undefined1 in_stack_ffffffffffffffb6;
  undefined1 in_stack_ffffffffffffffb7;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  PrimaryChromaticity *in_stack_ffffffffffffffc8;
  PrimaryChromaticity *in_stack_ffffffffffffffd0;
  PrimaryChromaticity *in_stack_ffffffffffffffd8;
  PrimaryChromaticity *in_stack_ffffffffffffffe0;
  MasteringMetadata *this;
  bool local_1;
  
  bVar1 = MasteringMetadataValuePresent((double)*(float *)(in_RDI + 4));
  if (bVar1) {
    mkvmuxer::MasteringMetadata::set_luminance_max(in_RSI,*(float *)(in_RDI + 4));
  }
  bVar1 = MasteringMetadataValuePresent((double)*(float *)((long)in_RDI + 0x24));
  if (bVar1) {
    mkvmuxer::MasteringMetadata::set_luminance_min(in_RSI,*(float *)((long)in_RDI + 0x24));
  }
  std::unique_ptr<mkvmuxer::PrimaryChromaticity,std::default_delete<mkvmuxer::PrimaryChromaticity>>
  ::unique_ptr<std::default_delete<mkvmuxer::PrimaryChromaticity>,void>
            ((unique_ptr<mkvmuxer::PrimaryChromaticity,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>
              *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  std::unique_ptr<mkvmuxer::PrimaryChromaticity,std::default_delete<mkvmuxer::PrimaryChromaticity>>
  ::unique_ptr<std::default_delete<mkvmuxer::PrimaryChromaticity>,void>
            ((unique_ptr<mkvmuxer::PrimaryChromaticity,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>
              *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  std::unique_ptr<mkvmuxer::PrimaryChromaticity,std::default_delete<mkvmuxer::PrimaryChromaticity>>
  ::unique_ptr<std::default_delete<mkvmuxer::PrimaryChromaticity>,void>
            ((unique_ptr<mkvmuxer::PrimaryChromaticity,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>
              *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  std::unique_ptr<mkvmuxer::PrimaryChromaticity,std::default_delete<mkvmuxer::PrimaryChromaticity>>
  ::unique_ptr<std::default_delete<mkvmuxer::PrimaryChromaticity>,void>
            ((unique_ptr<mkvmuxer::PrimaryChromaticity,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>
              *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  if ((*in_RDI == 0) ||
     (in_stack_ffffffffffffffb7 =
           CopyPrimaryChromaticity
                     ((PrimaryChromaticity *)
                      CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                      (PrimaryChromaticityPtr *)
                      CONCAT17(in_stack_ffffffffffffffb7,
                               CONCAT16(in_stack_ffffffffffffffb6,
                                        CONCAT15(in_stack_ffffffffffffffb5,
                                                 CONCAT14(in_stack_ffffffffffffffb4,
                                                          in_stack_ffffffffffffffb0))))),
     (bool)in_stack_ffffffffffffffb7)) {
    if ((in_RDI[1] == 0) ||
       (in_stack_ffffffffffffffb6 =
             CopyPrimaryChromaticity
                       ((PrimaryChromaticity *)
                        CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                        (PrimaryChromaticityPtr *)
                        CONCAT17(in_stack_ffffffffffffffb7,
                                 CONCAT16(in_stack_ffffffffffffffb6,
                                          CONCAT15(in_stack_ffffffffffffffb5,
                                                   CONCAT14(in_stack_ffffffffffffffb4,
                                                            in_stack_ffffffffffffffb0))))),
       (bool)in_stack_ffffffffffffffb6)) {
      if ((in_RDI[2] == 0) ||
         (in_stack_ffffffffffffffb5 =
               CopyPrimaryChromaticity
                         ((PrimaryChromaticity *)
                          CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                          (PrimaryChromaticityPtr *)
                          CONCAT17(in_stack_ffffffffffffffb7,
                                   CONCAT16(in_stack_ffffffffffffffb6,
                                            CONCAT15(in_stack_ffffffffffffffb5,
                                                     CONCAT14(in_stack_ffffffffffffffb4,
                                                              in_stack_ffffffffffffffb0))))),
         (bool)in_stack_ffffffffffffffb5)) {
        if ((in_RDI[3] == 0) ||
           (bVar1 = CopyPrimaryChromaticity
                              ((PrimaryChromaticity *)
                               CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                               (PrimaryChromaticityPtr *)
                               CONCAT17(in_stack_ffffffffffffffb7,
                                        CONCAT16(in_stack_ffffffffffffffb6,
                                                 CONCAT15(in_stack_ffffffffffffffb5,
                                                          CONCAT14(in_stack_ffffffffffffffb4,
                                                                   in_stack_ffffffffffffffb0))))),
           bVar1)) {
          in_stack_ffffffffffffff90 = in_RSI;
          this = in_stack_ffffffffffffff90;
          std::
          unique_ptr<mkvmuxer::PrimaryChromaticity,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>
          ::get((unique_ptr<mkvmuxer::PrimaryChromaticity,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>
                 *)in_stack_ffffffffffffff90);
          std::
          unique_ptr<mkvmuxer::PrimaryChromaticity,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>
          ::get((unique_ptr<mkvmuxer::PrimaryChromaticity,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>
                 *)in_stack_ffffffffffffff90);
          std::
          unique_ptr<mkvmuxer::PrimaryChromaticity,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>
          ::get((unique_ptr<mkvmuxer::PrimaryChromaticity,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>
                 *)in_stack_ffffffffffffff90);
          std::
          unique_ptr<mkvmuxer::PrimaryChromaticity,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>
          ::get((unique_ptr<mkvmuxer::PrimaryChromaticity,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>
                 *)in_stack_ffffffffffffff90);
          bVar1 = mkvmuxer::MasteringMetadata::SetChromaticity
                            (this,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                             in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
          if (bVar1) {
            local_1 = true;
          }
          else {
            local_1 = false;
          }
        }
        else {
          local_1 = false;
        }
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  std::
  unique_ptr<mkvmuxer::PrimaryChromaticity,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>::
  ~unique_ptr((unique_ptr<mkvmuxer::PrimaryChromaticity,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>
               *)in_stack_ffffffffffffff90);
  std::
  unique_ptr<mkvmuxer::PrimaryChromaticity,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>::
  ~unique_ptr((unique_ptr<mkvmuxer::PrimaryChromaticity,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>
               *)in_stack_ffffffffffffff90);
  std::
  unique_ptr<mkvmuxer::PrimaryChromaticity,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>::
  ~unique_ptr((unique_ptr<mkvmuxer::PrimaryChromaticity,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>
               *)in_stack_ffffffffffffff90);
  std::
  unique_ptr<mkvmuxer::PrimaryChromaticity,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>::
  ~unique_ptr((unique_ptr<mkvmuxer::PrimaryChromaticity,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>
               *)in_stack_ffffffffffffff90);
  return local_1;
}

Assistant:

bool CopyMasteringMetadata(const mkvparser::MasteringMetadata& parser_mm,
                           mkvmuxer::MasteringMetadata* muxer_mm) {
  if (MasteringMetadataValuePresent(parser_mm.luminance_max))
    muxer_mm->set_luminance_max(parser_mm.luminance_max);
  if (MasteringMetadataValuePresent(parser_mm.luminance_min))
    muxer_mm->set_luminance_min(parser_mm.luminance_min);

  PrimaryChromaticityPtr r_ptr(nullptr);
  PrimaryChromaticityPtr g_ptr(nullptr);
  PrimaryChromaticityPtr b_ptr(nullptr);
  PrimaryChromaticityPtr wp_ptr(nullptr);

  if (parser_mm.r) {
    if (!CopyPrimaryChromaticity(*parser_mm.r, &r_ptr))
      return false;
  }
  if (parser_mm.g) {
    if (!CopyPrimaryChromaticity(*parser_mm.g, &g_ptr))
      return false;
  }
  if (parser_mm.b) {
    if (!CopyPrimaryChromaticity(*parser_mm.b, &b_ptr))
      return false;
  }
  if (parser_mm.white_point) {
    if (!CopyPrimaryChromaticity(*parser_mm.white_point, &wp_ptr))
      return false;
  }

  if (!muxer_mm->SetChromaticity(r_ptr.get(), g_ptr.get(), b_ptr.get(),
                                 wp_ptr.get())) {
    return false;
  }

  return true;
}